

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Preferences.cxx
# Opt level: O0

void __thiscall Fl_Preferences::~Fl_Preferences(Fl_Preferences *this)

{
  RootNode *this_00;
  Node *pNVar1;
  Fl_Preferences *this_local;
  
  this->_vptr_Fl_Preferences = (_func_int **)&PTR__Fl_Preferences_002ecfc8;
  if (((this->node != (Node *)0x0) && (pNVar1 = Node::parent(this->node), pNVar1 == (Node *)0x0)) &&
     (this_00 = this->rootNode, this_00 != (RootNode *)0x0)) {
    RootNode::~RootNode(this_00);
    operator_delete(this_00,0x20);
  }
  this->node = (Node *)0x0;
  this->rootNode = (RootNode *)0x0;
  return;
}

Assistant:

Fl_Preferences::~Fl_Preferences() {
  if (node && !node->parent()) delete rootNode;
  // DO NOT delete nodes! The root node will do that after writing the preferences
  // zero all pointer to avoid memory errors, even though
  // Valgrind does not complain (Cygwin does though)
  node = 0L;
  rootNode = 0L;
}